

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rosenbrock.cpp
# Opt level: O3

double rosenbrock(VectorXd *x)

{
  double dVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  if (*(long *)(x + 8) < 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"dimension must be greater one",0x1d);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
    std::ostream::put('0');
    std::ostream::flush();
    dVar3 = 0.0;
  }
  else {
    dVar3 = 0.0;
    lVar2 = 1;
    dVar4 = **(double **)x;
    do {
      dVar1 = (*(double **)x)[lVar2];
      dVar5 = dVar4 * dVar4 - dVar1;
      dVar3 = dVar3 + dVar5 * dVar5 * 100.0 + (dVar4 + -1.0) * (dVar4 + -1.0);
      lVar2 = lVar2 + 1;
      dVar4 = dVar1;
    } while (*(long *)(x + 8) != lVar2);
  }
  return dVar3;
}

Assistant:

double rosenbrock(Eigen::VectorXd x)
{
	if (x.size() < 2)
	{
		std::cout << "dimension must be greater one" << std::endl;
		return 0;
	}
	else
	{
		double f = 0;
		for (int i = 0; i < x.size() - 1; i++)
			f += 100 * (pow((pow((x(i, 0)), 2) - x(i + 1, 0)), 2)) + pow((x(i, 0) - 1), 2);
		return f;
	}
}